

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::add_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  uint uVar4;
  vm_lookup_val *pvVar5;
  
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&key->field_0x4;
  aVar1 = key->val;
  sp_ = sp_ + 1;
  pvVar3->typ = key->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&val->field_0x4;
  aVar1 = val->val;
  sp_ = sp_ + 1;
  pvVar3->typ = val->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  uVar4 = calc_key_hash(this,key);
  pvVar5 = alloc_new_entry(this);
  pvVar5->nxt = *(vm_lookup_val **)
                 ((this->super_CVmObjCollection).super_CVmObject.ext_ + (ulong)uVar4 * 8 + 0x20);
  *(vm_lookup_val **)((this->super_CVmObjCollection).super_CVmObject.ext_ + (ulong)uVar4 * 8 + 0x20)
       = pvVar5;
  uVar2 = *(undefined4 *)&key->field_0x4;
  aVar1 = key->val;
  (pvVar5->key).typ = key->typ;
  *(undefined4 *)&(pvVar5->key).field_0x4 = uVar2;
  (pvVar5->key).val = aVar1;
  uVar2 = *(undefined4 *)&val->field_0x4;
  aVar1 = val->val;
  (pvVar5->val).typ = val->typ;
  *(undefined4 *)&(pvVar5->val).field_0x4 = uVar2;
  (pvVar5->val).val = aVar1;
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjLookupTable::add_entry(VMG_ 
                                  const vm_val_t *key, const vm_val_t *val)
{
    uint hashval;
    vm_lookup_val *entry;

    /* push the key and value as gc protection for a moment */
    G_stk->push(key);
    G_stk->push(val);
    
    /* calculate the hash value for the key */
    hashval = calc_key_hash(vmg_ key);

    /* allocate an entry */
    entry = alloc_new_entry(vmg0_);

    /* link this entry into the chain at this hash value */
    entry->nxt = get_ext()->buckets[hashval];
    get_ext()->buckets[hashval] = entry;

    /* set the key and value for this entry */
    entry->key = *key;
    entry->val = *val;

    /* discard the gc protection */
    G_stk->discard(2);
}